

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QPoint __thiscall
QIconModeViewBase::initDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  QListViewItem *pQVar1;
  QListViewPrivate *pQVar2;
  QAbstractItemModel *pQVar3;
  Data *pDVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = info->first;
  if (iVar6 == 0) {
    uVar10 = (info->bounds).x1.m_i + info->spacing;
    uVar11 = (ulong)(uint)(info->spacing + (info->bounds).y1.m_i);
    pQVar2 = (this->super_QCommonListViewBase).dd;
    pQVar3 = (pQVar2->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_50,&(pQVar2->super_QAbstractItemViewPrivate).root);
    iVar6 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_50);
    pDVar4 = (((this->super_QCommonListViewBase).dd)->hiddenRows).q_hash.d;
    if (pDVar4 == (Data *)0x0) {
      iVar7 = 0;
    }
    else {
      iVar7 = (int)pDVar4->size;
    }
    QList<QListViewItem>::reserve(&this->items,(long)(iVar6 - iVar7));
  }
  else {
    iVar7 = 1;
    if (iVar6 < 1) {
      iVar7 = iVar6;
    }
    pQVar1 = (this->items).d.ptr;
    uVar10 = iVar6 - 1;
    do {
      uVar9 = uVar10;
      iVar5 = iVar7 + -1;
      if (iVar6 < 2) break;
      iVar5 = iVar6 + -1;
      uVar10 = uVar9 - 1;
      iVar6 = iVar5;
    } while ((((int)pQVar1[uVar9].w + pQVar1[uVar9].x + -1 < pQVar1[uVar9].x) ||
             ((int)pQVar1[uVar9].h + pQVar1[uVar9].y + -1 < pQVar1[uVar9].y)) ||
            (pQVar1[uVar9].indexHint < 0));
    pQVar1 = (this->items).d.ptr + iVar5;
    uVar10 = pQVar1->x;
    uVar11 = (ulong)(uint)pQVar1->y;
    uVar9 = (info->grid).wd.m_i;
    uVar8 = (info->grid).ht.m_i;
    bVar12 = (int)(uVar9 | uVar8) < 0;
    if (info->flow == LeftToRight) {
      if (bVar12) {
        uVar9 = (uint)pQVar1->w;
      }
      uVar10 = uVar9 + uVar10 + info->spacing;
    }
    else {
      if (bVar12) {
        uVar8 = (uint)pQVar1->h;
      }
      uVar11 = (ulong)(uVar8 + pQVar1->y + info->spacing);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QPoint)((ulong)uVar10 | uVar11 << 0x20);
}

Assistant:

QPoint QIconModeViewBase::initDynamicLayout(const QListViewLayoutInfo &info)
{
    int x, y;
    if (info.first == 0) {
        x = info.bounds.x() + info.spacing;
        y = info.bounds.y() + info.spacing;
        items.reserve(rowCount() - hiddenCount());
    } else {
        int idx = info.first - 1;
        while (idx > 0 && !items.at(idx).isValid())
            --idx;
        const QListViewItem &item = items.at(idx);
        x = item.x;
        y = item.y;
        if (info.flow == QListView::LeftToRight)
            x += (info.grid.isValid() ? info.grid.width() : item.w) + info.spacing;
        else
            y += (info.grid.isValid() ? info.grid.height() : item.h) + info.spacing;
    }
    return QPoint(x, y);
}